

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_28(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  logic_error *e_1;
  QPDFObjectHandle local_98;
  logic_error *e;
  string local_78 [48];
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  QPDFObjectHandle local_28;
  char *local_18;
  char *arg2_local;
  QPDF *pdf_local;
  
  local_18 = arg2;
  arg2_local = (char *)pdf;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"/QTest",(allocator<char> *)((long)&e + 7));
  QPDFObjectHandle::getKey((string *)&local_38);
  QPDF::copyForeignObject((QPDFObjectHandle *)&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::newInteger((longlong)&e_1);
  QPDF::copyForeignObject((QPDFObjectHandle *)&local_98);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&e_1);
  poVar1 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
test_28(QPDF& pdf, char const* arg2)
{
    // Copy foreign object errors
    try {
        pdf.copyForeignObject(pdf.getTrailer().getKey("/QTest"));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        pdf.copyForeignObject(QPDFObjectHandle::newInteger(1));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}